

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O3

void __thiscall Memory::HeapAllocatorData::LogFree(HeapAllocatorData *this,HeapAllocRecord *record)

{
  HeapAllocRecord *pHVar1;
  HeapAllocRecord *pHVar2;
  StackBackTrace *obj;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  HeapAllocatorData *pHVar6;
  
  if (record->data != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0x1d8,"(record->data == this)","record->data == this");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pHVar1 = record->prev;
  pHVar2 = record->next;
  if (pHVar2 != (HeapAllocRecord *)0x0) {
    pHVar2->prev = pHVar1;
  }
  pHVar6 = (HeapAllocatorData *)&pHVar1->next;
  if (pHVar1 == (HeapAllocRecord *)0x0) {
    pHVar6 = this;
  }
  pHVar6->head = pHVar2;
  this->deleteCount = this->deleteCount + 1;
  this->outstandingBytes = this->outstandingBytes - record->size;
  obj = record->stacktrace;
  if (obj != (StackBackTrace *)0x0) {
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,StackBackTrace>
              ((AllocatorType *)&NoCheckHeapAllocator::Instance,obj,
               (ulong)obj->requestedFramesToCapture << 3);
    return;
  }
  return;
}

Assistant:

void
HeapAllocatorData::LogFree(HeapAllocRecord * record)
{
    Assert(record->data == this);

    // This is an expensive check for double free
#if 0
    HeapAllocRecord * curr = head;
    while (curr != nullptr)
    {
        if (curr == record)
        {
            break;
        }
        curr = curr->next;
    }
    Assert(curr != nullptr);
#endif
    if (record->next != nullptr)
    {
        record->next->prev = record->prev;
    }
    if (record->prev == nullptr)
    {
        head = record->next;
    }
    else
    {
        record->prev->next = record->next;
    }

    deleteCount++;
    outstandingBytes -= record->size;
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (record->stacktrace != nullptr)
    {
        record->stacktrace->Delete(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}